

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

void __thiscall ON_SubD::ShareDimple(ON_SubD *this,ON_SubDMeshImpl *subd_limple)

{
  element_type *peVar1;
  element_type *peVar2;
  ON_SubDimple *subd_imple;
  shared_ptr<ON_SubDimple> limple_sp;
  ON_SubDMeshImpl *subd_limple_local;
  ON_SubD *this_local;
  
  limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)subd_limple;
  std::weak_ptr<ON_SubDimple>::lock((weak_ptr<ON_SubDimple> *)&subd_imple);
  peVar1 = std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(this->m_subdimple_sp).
                       super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>);
  peVar2 = std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2> *)&subd_imple);
  if (peVar2 == (element_type *)0x0) {
    ON_SubDMeshImpl::ClearFragmentFacePointers
              ((ON_SubDMeshImpl *)
               limple_sp.super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi,true);
  }
  peVar2 = std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::get
                     ((__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2> *)&subd_imple);
  if (peVar1 != peVar2) {
    std::__shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_subdimple_sp).super___shared_ptr<ON_SubDimple,_(__gnu_cxx::_Lock_policy)2>)
    ;
    std::shared_ptr<ON_SubDimple>::operator=
              (&this->m_subdimple_sp,(shared_ptr<ON_SubDimple> *)&subd_imple);
  }
  std::shared_ptr<ON_SubDimple>::~shared_ptr((shared_ptr<ON_SubDimple> *)&subd_imple);
  return;
}

Assistant:

void ON_SubD::ShareDimple(const class ON_SubDMeshImpl& subd_limple)
{
  std::shared_ptr<ON_SubDimple> limple_sp(subd_limple.m_subdimple_wp.lock());

  const ON_SubDimple* subd_imple = m_subdimple_sp.get();

  if (nullptr == limple_sp.get())
  {
    // weak pointer is nullptr, meaning there are no known references to the
    // subd used to create this limit mesh.
    const_cast<ON_SubDMeshImpl&>(subd_limple).ClearFragmentFacePointers(true);
  }

  if (subd_imple != limple_sp.get())
  {
    m_subdimple_sp.reset();
    m_subdimple_sp = limple_sp;
  }
}